

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# named_local_mbox.cpp
# Opt level: O1

void __thiscall
so_5::impl::named_local_mbox_t::named_local_mbox_t
          (named_local_mbox_t *this,string *name,mbox_t *mbox,mbox_core_t *mbox_core)

{
  pointer pcVar1;
  abstract_message_box_t *paVar2;
  
  abstract_message_box_t::abstract_message_box_t(&this->super_abstract_message_box_t);
  (this->super_abstract_message_box_t)._vptr_abstract_message_box_t =
       (_func_int **)&PTR__named_local_mbox_t_0028ad88;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  mbox_core_ref_t::mbox_core_ref_t(&this->m_mbox_core,mbox_core);
  paVar2 = mbox->m_obj;
  (this->m_mbox).m_obj = paVar2;
  if (paVar2 != (abstract_message_box_t *)0x0) {
    LOCK();
    (paVar2->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i =
         (paVar2->super_atomic_refcounted_t).m_ref_counter.super___atomic_base<unsigned_long>._M_i +
         1;
    UNLOCK();
  }
  return;
}

Assistant:

named_local_mbox_t::named_local_mbox_t(
	const std::string & name,
	const mbox_t & mbox,
	impl::mbox_core_t & mbox_core )
	:
		m_name( name ),
		m_mbox_core( &mbox_core ),
		m_mbox( mbox )
{
}